

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  bool bVar1;
  int status;
  undefined1 local_58 [8];
  string length;
  
  status = res->status;
  length.field_2._8_8_ = req;
  if (status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/contrib/httplib/httplib.h"
                  ,0x5fa,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->error_handler_,req,res);
    status = res->status;
  }
  local_58 = (undefined1  [8])detail::status_message(status);
  Stream::write_format<int,char_const*>(strm,"HTTP/1.1 %d %s\r\n",&res->status,(char **)local_58);
  if (!last_connection) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            length.field_2._8_8_,"HTTP/1.0");
    if (!bVar1) {
      Request::get_header_value_abi_cxx11_
                ((string *)local_58,(Request *)length.field_2._8_8_,"Connection");
      bVar1 = std::operator==((string *)local_58,"close");
      std::__cxx11::string::~string((string *)local_58);
      if (!bVar1) goto LAB_001522ab;
    }
  }
  Response::set_header(res,"Connection","close");
LAB_001522ab:
  if ((res->body)._M_string_length != 0) {
    bVar1 = Response::has_header(res,"Content-Type");
    if (!bVar1) {
      Response::set_header(res,"Content-Type","text/plain");
    }
    std::__cxx11::to_string((string *)local_58,(res->body)._M_string_length);
    Response::set_header(res,"Content-Length",(char *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  detail::write_headers<httplib::Response>(strm,res);
  if ((res->body)._M_string_length != 0) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (length.field_2._8_8_ + 0x20),"HEAD");
    if (bVar1) {
      (*strm->_vptr_Stream[3])(strm,(res->body)._M_dataplus._M_p,(res->body)._M_string_length);
    }
  }
  if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&this->logger_,(Request *)length.field_2._8_8_,res);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.version == "HTTP/1.0" ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!res.body.empty()) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (!res.body.empty() && req.method != "HEAD") {
        strm.write(res.body.c_str(), res.body.size());
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}